

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall TiXmlText::CopyTo(TiXmlText *this,TiXmlText *target)

{
  TiXmlText *target_local;
  TiXmlText *this_local;
  
  TiXmlNode::CopyTo(&this->super_TiXmlNode,&target->super_TiXmlNode);
  target->cdata = (bool)(this->cdata & 1);
  return;
}

Assistant:

void TiXmlText::CopyTo( TiXmlText* target ) const
{
	TiXmlNode::CopyTo( target );
	target->cdata = cdata;
}